

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O2

void __thiscall csv::internals::MmapParser::next(MmapParser *this,size_t bytes)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *token;
  element_type *peVar1;
  undefined8 *puVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  int *piVar7;
  error_code *in_R9;
  ulong offset;
  undefined1 local_80 [16];
  error_code error;
  __shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2> local_60;
  CSVRow local_50;
  
  (this->super_IBasicCSVParser).field_start = -1;
  (this->super_IBasicCSVParser).field_length = 0;
  IBasicCSVParser::reset_data_ptr(&this->super_IBasicCSVParser);
  token = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->mmap_pos;
  offset = (this->super_IBasicCSVParser).source_size - (long)token;
  if (bytes <= offset) {
    offset = bytes;
  }
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  mio::make_mmap<mio::basic_mmap<(mio::access_mode)0,char>,std::__cxx11::string>
            ((basic_mmap<(mio::access_mode)0,_char> *)&local_50,(mio *)&this->_filename,token,offset
             ,(int64_t)&error,in_R9);
  std::
  make_shared<mio::basic_mmap<(mio::access_mode)0,char>,mio::basic_mmap<(mio::access_mode)0,char>>
            ((basic_mmap<(mio::access_mode)0,_char> *)local_80);
  std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)
             (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (__shared_ptr<mio::basic_mmap<(mio::access_mode)0,_char>,_(__gnu_cxx::_Lock_policy)2> *
             )local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  mio::basic_mmap<(mio::access_mode)0,_char>::~basic_mmap
            ((basic_mmap<(mio::access_mode)0,_char> *)&local_50);
  this->mmap_pos = this->mmap_pos + offset;
  if (error._M_value == 0) {
    peVar1 = (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    puVar2 = (undefined8 *)
             (peVar1->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar3 = (char *)*puVar2;
    (peVar1->data)._M_len = puVar2[1];
    (peVar1->data)._M_str = pcVar3;
    std::__shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,
               &(this->super_IBasicCSVParser).data_ptr.
                super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>);
    CSVRow::CSVRow(&local_50,(RawCSVDataPtr *)&local_60);
    CSVRow::operator=(&(this->super_IBasicCSVParser).current_row,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.data.
                super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    sVar5 = IBasicCSVParser::parse(&this->super_IBasicCSVParser);
    uVar4 = (this->super_IBasicCSVParser).source_size;
    uVar6 = this->mmap_pos;
    if (uVar6 == uVar4 || uVar4 < 10000000) {
      (this->super_IBasicCSVParser)._eof = true;
      IBasicCSVParser::end_feed(&this->super_IBasicCSVParser);
      uVar6 = this->mmap_pos;
    }
    this->mmap_pos = (sVar5 - offset) + uVar6;
    return;
  }
  piVar7 = (int *)__cxa_allocate_exception(0x10);
  *piVar7 = error._M_value;
  piVar7[1] = error._4_4_;
  piVar7[2] = (int)error._M_cat;
  piVar7[3] = error._M_cat._4_4_;
  __cxa_throw(piVar7,&std::error_code::typeinfo,0);
}

Assistant:

CSV_INLINE void MmapParser::next(size_t bytes = ITERATION_CHUNK_SIZE) {
            // Reset parser state
            this->field_start = UNINITIALIZED_FIELD;
            this->field_length = 0;
            this->reset_data_ptr();

            // Create memory map
            size_t length = std::min(this->source_size - this->mmap_pos, bytes);
            std::error_code error;
            this->data_ptr->_data = std::make_shared<mio::basic_mmap_source<char>>(mio::make_mmap_source(this->_filename, this->mmap_pos, length, error));
            this->mmap_pos += length;
            if (error) throw error;

            auto mmap_ptr = (mio::basic_mmap_source<char>*)(this->data_ptr->_data.get());

            // Create string view
            this->data_ptr->data = csv::string_view(mmap_ptr->data(), mmap_ptr->length());

            // Parse
            this->current_row = CSVRow(this->data_ptr);
            size_t remainder = this->parse();            

            if (this->mmap_pos == this->source_size || no_chunk()) {
                this->_eof = true;
                this->end_feed();
            }

            this->mmap_pos -= (length - remainder);
        }